

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O0

ScriptFunction *
Js::EngineInterfaceObject::CreateLibraryCodeScriptFunction
          (ScriptFunction *scriptFunction,JavascriptString *displayName,bool isConstructor,
          bool isJsBuiltIn,bool isPublic)

{
  code *pcVar1;
  char16 *this;
  bool bVar2;
  Attributes AVar3;
  int iVar4;
  BOOL BVar5;
  charcount_t cVar6;
  FunctionProxy *pFVar7;
  undefined4 *puVar8;
  DynamicType *this_00;
  DynamicTypeHandler *pDVar9;
  JavascriptLibrary *this_01;
  FunctionInfo *this_02;
  undefined4 extraout_var;
  ParseableFunctionInfo *pPVar10;
  JavascriptString *pJVar11;
  FunctionBody *this_03;
  JavascriptString *local_70;
  JavascriptString *funcName;
  JavascriptString *existingNameString;
  Var existingName;
  char16_t *pcStack_50;
  charcount_t shortNameOffset;
  char16 *shortName;
  char16_t *pcStack_40;
  charcount_t methodNameLength;
  char16 *methodNameBuf;
  FunctionInfo *info;
  ScriptContext *scriptContext;
  bool isPublic_local;
  bool isJsBuiltIn_local;
  JavascriptString *pJStack_20;
  bool isConstructor_local;
  JavascriptString *displayName_local;
  ScriptFunction *scriptFunction_local;
  
  scriptContext._5_1_ = isPublic;
  scriptContext._6_1_ = isJsBuiltIn;
  scriptContext._7_1_ = isConstructor;
  pJStack_20 = displayName;
  displayName_local = (JavascriptString *)scriptFunction;
  pFVar7 = ScriptFunction::GetFunctionProxy(scriptFunction);
  bVar2 = FunctionProxy::IsPublicLibraryCode(pFVar7);
  if (bVar2) {
    scriptFunction_local = (ScriptFunction *)displayName_local;
  }
  else {
    info = (FunctionInfo *)
           RecyclableObject::GetScriptContext(&displayName_local->super_RecyclableObject);
    if ((scriptContext._7_1_ & 1) == 0) {
      methodNameBuf =
           (char16 *)JavascriptFunction::GetFunctionInfo((JavascriptFunction *)displayName_local);
      AVar3 = FunctionInfo::GetAttributes((FunctionInfo *)methodNameBuf);
      if ((AVar3 & ErrorOnNew) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                    ,0x110,
                                    "((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                    ,
                                    "Why are we trying to disable construction of a function that already isn\'t constructable?"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      this = methodNameBuf;
      AVar3 = FunctionInfo::GetAttributes((FunctionInfo *)methodNameBuf);
      FunctionInfo::SetAttributes((FunctionInfo *)this,AVar3 | ErrorOnNew);
      this_00 = DynamicObject::GetDynamicType((DynamicObject *)displayName_local);
      pDVar9 = DynamicType::GetTypeHandler(this_00);
      iVar4 = (*pDVar9->_vptr_DynamicTypeHandler[0x4d])();
      if (iVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                    ,0x116,
                                    "(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())"
                                    ,
                                    "scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pJVar11 = displayName_local;
      this_01 = ScriptContext::GetLibrary((ScriptContext *)info);
      pDVar9 = JavascriptLibrary::GetDeferredFunctionWithLengthTypeHandler(this_01);
      DynamicTypeHandler::SetInstanceTypeHandler((DynamicObject *)pJVar11,pDVar9,true);
    }
    else {
      this_02 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)displayName_local);
      AVar3 = FunctionInfo::GetAttributes(this_02);
      if ((AVar3 & ErrorOnNew) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                    ,0x11d,
                                    "((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                    ,"Why is the function not constructable by default?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    if ((scriptContext._5_1_ & 1) != 0) {
      iVar4 = (*(pJStack_20->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
      pcStack_40 = (char16_t *)CONCAT44(extraout_var,iVar4);
      shortName._4_4_ = JavascriptString::GetLength(pJStack_20);
      pcStack_50 = PAL_wcsrchr(pcStack_40,L'.');
      existingName._4_4_ = 0;
      if (pcStack_50 != (char16_t *)0x0) {
        pcStack_50 = pcStack_50 + 1;
        existingName._4_4_ = (uint)((long)pcStack_50 - (long)pcStack_40 >> 1);
      }
      pFVar7 = ScriptFunction::GetFunctionProxy((ScriptFunction *)displayName_local);
      pPVar10 = FunctionProxy::EnsureDeserialized(pFVar7);
      (*(pPVar10->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[6])
                (pPVar10,pcStack_40,(ulong)shortName._4_4_,(ulong)existingName._4_4_,0);
      existingNameString = (JavascriptString *)0x0;
      BVar5 = Js::JavascriptOperators::GetOwnProperty
                        (displayName_local,0x106,&existingNameString,(ScriptContext *)info,
                         (PropertyValueInfo *)0x0);
      if (BVar5 != 0) {
        pJVar11 = VarTo<Js::JavascriptString>(existingNameString);
        cVar6 = JavascriptString::GetLength(pJVar11);
        if (cVar6 == 0) {
          existingNameString = (JavascriptString *)0x0;
        }
      }
      if ((existingNameString == (JavascriptString *)0x0) ||
         (BVar5 = Js::JavascriptOperators::IsUndefined(existingNameString), BVar5 != 0)) {
        local_70 = pJStack_20;
        if (pcStack_50 != (char16 *)0x0) {
          local_70 = JavascriptString::NewCopyBuffer
                               (pcStack_50,shortName._4_4_ - existingName._4_4_,
                                (ScriptContext *)info);
        }
        (*(displayName_local->super_RecyclableObject).super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                  (displayName_local,0x106,local_70,2,0,0,0xf);
      }
      pFVar7 = ScriptFunction::GetFunctionProxy((ScriptFunction *)displayName_local);
      FunctionProxy::SetIsPublicLibraryCode(pFVar7);
    }
    if ((scriptContext._6_1_ & 1) != 0) {
      pFVar7 = ScriptFunction::GetFunctionProxy((ScriptFunction *)displayName_local);
      FunctionProxy::SetIsJsBuiltInCode(pFVar7);
      ScriptFunction::SetEnvironment
                ((ScriptFunction *)displayName_local,(FrameDisplay *)&StrictNullFrameDisplay);
      pFVar7 = ScriptFunction::GetFunctionProxy((ScriptFunction *)displayName_local);
      FunctionProxy::EnsureDeserialized(pFVar7);
      bVar2 = ScriptFunction::HasFunctionBody((ScriptFunction *)displayName_local);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                    ,0x157,"(scriptFunction->HasFunctionBody())",
                                    "scriptFunction->HasFunctionBody()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      this_03 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)displayName_local);
      FunctionBody::SetJsBuiltInForceInline(this_03);
    }
    scriptFunction_local = (ScriptFunction *)displayName_local;
  }
  return scriptFunction_local;
}

Assistant:

ScriptFunction *EngineInterfaceObject::CreateLibraryCodeScriptFunction(ScriptFunction *scriptFunction, JavascriptString *displayName, bool isConstructor, bool isJsBuiltIn, bool isPublic)
    {
        if (scriptFunction->GetFunctionProxy()->IsPublicLibraryCode())
        {
            // this can happen when we re-initialize Intl for a different mode -- for instance, if we have the following JS:
            // print((1).toLocaleString())
            // print(new Intl.NumberFormat().format(1))
            // Intl will first get initialized for Number, and then will get re-initialized for all of Intl. This will cause
            // Number.prototype.toLocaleString to be registered twice, which breaks some of our assertions below.
            return scriptFunction;
        }

        ScriptContext *scriptContext = scriptFunction->GetScriptContext();

        if (!isConstructor)
        {
            // set the ErrorOnNew attribute to disallow construction. JsBuiltIn/Intl functions are usually regular ScriptFunctions
            // (not lambdas or class methods), so they are usually constructable by default.
            FunctionInfo *info = scriptFunction->GetFunctionInfo();
            AssertMsg((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why are we trying to disable construction of a function that already isn't constructable?");
            info->SetAttributes((FunctionInfo::Attributes) (info->GetAttributes() | FunctionInfo::Attributes::ErrorOnNew));

            // Assert that the type handler is deferred to ensure that we aren't overwriting previous modifications.
            // Script functions start with deferred type handlers, which undefer as soon as any property is modified.
            // Since the function that is passed in should be an inline function expression, its type should still be deferred by the time it gets here.
            AssertOrFailFast(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler());

            // give the function a type handler with name and length but without prototype
            DynamicTypeHandler::SetInstanceTypeHandler(scriptFunction, scriptContext->GetLibrary()->GetDeferredFunctionWithLengthTypeHandler());
        }
        else
        {
            AssertMsg((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why is the function not constructable by default?");
        }

        if (isPublic)
        {
            // Use GetSz rather than GetString because we use wcsrchr below, which expects a null-terminated string
            // Callers can pass in a string like "get compare" or "Intl.Collator.prototype.resolvedOptions" -- only for the
            // latter do we extract a shortName.
            const char16 *methodNameBuf = displayName->GetSz();
            charcount_t methodNameLength = displayName->GetLength();
            const char16 *shortName = wcsrchr(methodNameBuf, _u('.'));
            charcount_t shortNameOffset = 0;
            if (shortName != nullptr)
            {
                shortName++;
                shortNameOffset = static_cast<charcount_t>(shortName - methodNameBuf);
            }

            scriptFunction->GetFunctionProxy()->EnsureDeserialized()->SetDisplayName(methodNameBuf, methodNameLength, shortNameOffset);

            // handle the name property AFTER handling isConstructor, because this can initialize the function's deferred type
            Var existingName = nullptr;
            if (JavascriptOperators::GetOwnProperty(scriptFunction, PropertyIds::name, &existingName, scriptContext, nullptr))
            {
                JavascriptString *existingNameString = VarTo<JavascriptString>(existingName);
                if (existingNameString->GetLength() == 0)
                {
                    // Only overwrite the name of the function object if it was anonymous coming in
                    // If the input function was named, it is likely intentional
                    existingName = nullptr;
                }
            }

            if (existingName == nullptr || JavascriptOperators::IsUndefined(existingName))
            {
                // It is convenient to set the name here rather than in script, since it is often duplicated.
                JavascriptString *funcName = displayName;
                if (shortName)
                {
                    funcName = JavascriptString::NewCopyBuffer(shortName, methodNameLength - shortNameOffset, scriptContext);
                }

                scriptFunction->SetPropertyWithAttributes(PropertyIds::name, funcName, PropertyConfigurable, nullptr);
            }

            scriptFunction->GetFunctionProxy()->SetIsPublicLibraryCode();
        }

        if (isJsBuiltIn)
        {
            scriptFunction->GetFunctionProxy()->SetIsJsBuiltInCode();

            // This makes it so that the given scriptFunction can't reference/close over any outside variables,
            // which is desirable for JsBuiltIns (though currently not for Intl)
            scriptFunction->SetEnvironment(const_cast<FrameDisplay *>(&StrictNullFrameDisplay));

            // TODO(jahorto): investigate force-inlining Intl code
            scriptFunction->GetFunctionProxy()->EnsureDeserialized();
            AssertOrFailFast(scriptFunction->HasFunctionBody());
            scriptFunction->GetFunctionBody()->SetJsBuiltInForceInline();
        }

        return scriptFunction;
    }